

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::FiberStack::initialize(FiberStack *this,FiberBase *fiber)

{
  OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*> *this_00;
  DebugComparison<kj::OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>_&,_std::nullptr_t>
  _kjCondition;
  Fault f;
  DebugComparison<kj::OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>_&,_std::nullptr_t>
  local_38;
  Fault local_10;
  
  this_00 = &this->main;
  local_38.result = (this->main).tag == 0;
  local_38.right = (void *)0x0;
  local_38.op.content.ptr = " == ";
  local_38.op.content.size_ = 5;
  if (local_38.result) {
    local_38.left =
         (OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*> *)
         CONCAT44((int)((ulong)this_00 >> 0x20),1);
    local_38.right = fiber;
    OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>::operator=
              (this_00,(OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*> *)&local_38)
    ;
    return;
  }
  local_38.left = this_00;
  Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::OneOf<kj::_::FiberBase*,kj::_::FiberStack::SynchronousFunc*>&,decltype(nullptr)>&>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x637,FAILED,"this->main == nullptr","_kjCondition,",&local_38);
  Debug::Fault::fatal(&local_10);
}

Assistant:

void FiberStack::initialize(FiberBase& fiber) {
  KJ_REQUIRE(this->main == nullptr);
  this->main = &fiber;
}